

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

void Abc_SuppTest(int nOnes,int nVars,int fUseSimple,int fCheck,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Vec_Wrd_t *p;
  abctime aVar5;
  Vec_Wrd_t *local_248;
  Vec_Wrd_t *vPairs;
  Vec_Wrd_t *vRes;
  abctime clk;
  word Matrix [64];
  int nVarsMin;
  int fVerbose_local;
  int fCheck_local;
  int fUseSimple_local;
  int nVars_local;
  int nOnes_local;
  
  aVar4 = Abc_Clock();
  p = Abc_SuppGen(nOnes,nVars);
  if (fUseSimple == 0) {
    local_248 = Abc_SuppGenPairs(p,nVars);
  }
  else {
    local_248 = Abc_SuppGenPairs2(nOnes,nVars);
  }
  if (nVars < 100) {
    printf("M = %2d  N = %2d : ",(ulong)(uint)nOnes,(ulong)(uint)nVars);
    uVar1 = Vec_WrdSize(p);
    printf("K = %6d   ",(ulong)uVar1);
    iVar2 = Vec_WrdSize(p);
    iVar3 = Vec_WrdSize(p);
    printf("Total = %12.0f  ",(double)iVar2 * 0.5 * (double)(iVar3 + -1));
    uVar1 = Vec_WrdSize(local_248);
    printf("Distinct = %8d  ",(ulong)uVar1);
    aVar5 = Abc_Clock();
    Abc_PrintTime(1,"Reduction time",aVar5 - aVar4);
    aVar4 = Abc_Clock();
    uVar1 = Abc_SuppMinimize((word *)&clk,local_248,nVars,fVerbose);
    printf("Solution with %d variables found.  ",(ulong)uVar1);
    aVar5 = Abc_Clock();
    Abc_PrintTime(1,"Covering time",aVar5 - aVar4);
    if (fCheck != 0) {
      Abc_SuppVerify(p,(word *)&clk,nVars,uVar1);
    }
    Vec_WrdFree(local_248);
    Vec_WrdFree(p);
    return;
  }
  __assert_fail("nVars < 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilSupp.c"
                ,0x113,"void Abc_SuppTest(int, int, int, int, int)");
}

Assistant:

void Abc_SuppTest( int nOnes, int nVars, int fUseSimple, int fCheck, int fVerbose )
{
    int nVarsMin;
    word Matrix[64];
    abctime clk = Abc_Clock();
    // create the problem
    Vec_Wrd_t * vRes = Abc_SuppGen( nOnes, nVars );
    Vec_Wrd_t * vPairs = fUseSimple ? Abc_SuppGenPairs2( nOnes, nVars ) : Abc_SuppGenPairs( vRes, nVars );
    assert( nVars < 100 );
    printf( "M = %2d  N = %2d : ", nOnes, nVars );
    printf( "K = %6d   ",  Vec_WrdSize(vRes) );
    printf( "Total = %12.0f  ", 0.5 * Vec_WrdSize(vRes) * (Vec_WrdSize(vRes) - 1) );
    printf( "Distinct = %8d  ",  Vec_WrdSize(vPairs) );
    Abc_PrintTime( 1, "Reduction time", Abc_Clock() - clk );
    // solve the problem
    clk = Abc_Clock();
    nVarsMin = Abc_SuppMinimize( Matrix, vPairs, nVars, fVerbose );
    printf( "Solution with %d variables found.  ", nVarsMin );
    Abc_PrintTime( 1, "Covering time", Abc_Clock() - clk );
    if ( fCheck )
        Abc_SuppVerify( vRes, Matrix, nVars, nVarsMin );
    Vec_WrdFree( vPairs );
    Vec_WrdFree( vRes );
}